

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

Real __thiscall amrex::MLMG::MLResNormInf(MLMG *this,int alevmax,bool local)

{
  int alev;
  int alev_00;
  Real RVar1;
  Real RVar2;
  
  RVar1 = 0.0;
  for (alev_00 = 0; alev_00 <= alevmax; alev_00 = alev_00 + 1) {
    RVar2 = ResNormInf(this,alev_00,true);
    if (RVar2 <= RVar1) {
      RVar2 = RVar1;
    }
    RVar1 = RVar2;
  }
  return RVar1;
}

Assistant:

Real
MLMG::MLResNormInf (int alevmax, bool local)
{
    BL_PROFILE("MLMG::MLResNormInf()");
    Real r = 0.0;
    for (int alev = 0; alev <= alevmax; ++alev)
    {
        r = std::max(r, ResNormInf(alev,true));
    }
    if (!local) ParallelAllReduce::Max(r, ParallelContext::CommunicatorSub());
    return r;
}